

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O3

bool __thiscall Uniforms::haveChange(Uniforms *this)

{
  UniformFunctionsMap *this_00;
  Camera *pCVar1;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  char cVar4;
  bool bVar5;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  pCVar1 = (this->super_Scene).activeCamera;
  if ((pCVar1 == (Camera *)0x0) || (bVar5 = true, (pCVar1->super_Node).bChange == false)) {
    this_00 = &this->functions;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_time","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
             ::operator[](this_00,&local_50);
    cVar4 = '\x01';
    if (pmVar2->present == false) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"u_date","");
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
               ::operator[](this_00,&local_70);
      cVar4 = '\x01';
      if (pmVar2->present == false) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"u_delta","");
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                 ::operator[](this_00,&local_b0);
        cVar4 = '\x01';
        if (pmVar2->present == false) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"u_mouse","");
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                   ::operator[](this_00,&local_90);
          cVar4 = pmVar2->present;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar5 = true;
    if (cVar4 == '\0') {
      for (p_Var3 = (this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 !=
          &(this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        if (*(char *)(*(long *)(p_Var3 + 2) + 0x20) != '\0') {
          return true;
        }
      }
      if (this->m_change == false) {
        bVar5 = (this->super_Scene).streams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
      }
    }
  }
  return bVar5;
}

Assistant:

bool Uniforms::haveChange() { 
    if (activeCamera)
        if (activeCamera->bChange)
            return true;
            
    if (functions["u_time"].present || 
        functions["u_date"].present ||
        functions["u_delta"].present ||
        functions["u_mouse"].present)
        return true;

    for (vera::LightsMap::const_iterator it = lights.begin(); it != lights.end(); ++it)
        if (it->second->bChange)
            return true;

    if (m_change || streams.size() > 0)
        return true;

    return false;
}